

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O3

int properties_set_reply_to(PROPERTIES_HANDLE properties,AMQP_VALUE reply_to_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  int iVar2;
  
  if (properties == (PROPERTIES_HANDLE)0x0) {
    iVar2 = 0x4015;
  }
  else {
    iVar2 = 0x4025;
    if (reply_to_value != (AMQP_VALUE)0x0) {
      item_value = amqpvalue_clone(reply_to_value);
      if (item_value != (AMQP_VALUE)0x0) {
        iVar1 = amqpvalue_set_composite_item(properties->composite_value,4,item_value);
        iVar2 = 0x402b;
        if (iVar1 == 0) {
          iVar2 = 0;
        }
        amqpvalue_destroy(item_value);
      }
    }
  }
  return iVar2;
}

Assistant:

int properties_set_reply_to(PROPERTIES_HANDLE properties, AMQP_VALUE reply_to_value)
{
    int result;

    if (properties == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        PROPERTIES_INSTANCE* properties_instance = (PROPERTIES_INSTANCE*)properties;
        AMQP_VALUE reply_to_amqp_value;
        if (reply_to_value == NULL)
        {
            reply_to_amqp_value = NULL;
        }
        else
        {
            reply_to_amqp_value = amqpvalue_clone(reply_to_value);
        }
        if (reply_to_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(properties_instance->composite_value, 4, reply_to_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(reply_to_amqp_value);
        }
    }

    return result;
}